

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::EzRpcServer::Impl::ServerContext>_>_> __thiscall
kj::
heap<kj::_::AttachmentPromiseNode<kj::Own<capnp::EzRpcServer::Impl::ServerContext>>,kj::Own<kj::_::PromiseNode>,kj::Own<capnp::EzRpcServer::Impl::ServerContext>>
          (kj *this,Own<kj::_::PromiseNode> *params,
          Own<capnp::EzRpcServer::Impl::ServerContext> *params_1)

{
  ServerContext *pSVar1;
  AttachmentPromiseNodeBase *this_00;
  AttachmentPromiseNode<kj::Own<capnp::EzRpcServer::Impl::ServerContext>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::EzRpcServer::Impl::ServerContext>_>_> OVar2;
  
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,params);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006242c8;
  pSVar1 = params_1->ptr;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)params_1->disposer;
  this_00[1].dependency.disposer = (Disposer *)pSVar1;
  params_1->ptr = (ServerContext *)0x0;
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::EzRpcServer::Impl::ServerContext>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(this + 8) = this_00;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}